

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O0

void __thiscall
duckdb::Deserializer::ReadProperty<duckdb::vector<unsigned_long,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<unsigned_long,_true> *ret)

{
  undefined8 in_RDX;
  undefined2 in_SI;
  vector<unsigned_long,_true> *in_RDI;
  Deserializer *in_stack_00000008;
  vector<unsigned_long,_true> *in_stack_ffffffffffffffb8;
  
  (*(code *)(in_RDI->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[2])(in_RDI,in_SI,in_RDX,in_SI);
  Read<duckdb::vector<unsigned_long,true>>(in_stack_00000008);
  vector<unsigned_long,_true>::operator=(in_RDI,in_stack_ffffffffffffffb8);
  vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0x9c9940);
  (*(code *)(in_RDI->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[3])();
  return;
}

Assistant:

inline void ReadProperty(const field_id_t field_id, const char *tag, T &ret) {
		OnPropertyBegin(field_id, tag);
		ret = Read<T>();
		OnPropertyEnd();
	}